

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O1

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen9TextureCalc::Get1DTexOffsetAddressPerMip
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  uint uVar1;
  ulong uVar2;
  uint32_t NumSamples;
  ulong uVar3;
  GMM_GFX_SIZE_T GVar4;
  long lVar5;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t local_38;
  uint8_t local_31;
  
  uVar1 = MipLevel;
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) &&
     (uVar1 = (pTexInfo->Alignment).MipTailStartLod, MipLevel <= uVar1)) {
    uVar1 = MipLevel;
  }
  CompressDepth = (pTexInfo->Alignment).HAlign;
  uVar2 = pTexInfo->BaseWidth;
  local_38 = MipLevel;
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&CompressHeight,&local_4c,&local_48);
  if (uVar1 == 0) {
    lVar5 = 0;
  }
  else {
    uVar3 = 1;
    lVar5 = 0;
    CompressWidth = uVar1;
    do {
      NumSamples = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        NumSamples = (pTexInfo->MSAA).NumSamples;
      }
      uVar1 = GmmTextureCalc::ExpandWidth
                        (&this->super_GmmTextureCalc,(uint32_t)uVar2,CompressDepth,NumSamples);
      if (local_31 != '\0') {
        uVar1 = uVar1 / CompressHeight;
      }
      lVar5 = lVar5 + (ulong)uVar1;
      uVar1 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])(this,pTexInfo,uVar3);
      uVar2 = (ulong)uVar1;
      uVar1 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar1;
    } while (uVar1 <= CompressWidth);
  }
  GVar4 = (ulong)(pTexInfo->BitsPerPixel >> 3) * lVar5;
  if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) != 0) &&
     ((pTexInfo->Alignment).MipTailStartLod <= local_38)) {
    uVar1 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[9])(this,pTexInfo);
    GVar4 = GVar4 + uVar1;
  }
  return GVar4;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen9TextureCalc::Get1DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    uint32_t       AlignedMipWidth, MipWidth, __MipLevel;
    uint32_t       i, HAlign;
    GMM_GFX_SIZE_T MipOffset = 0;
    uint8_t        Compressed;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;

    GMM_DPF_ENTER;

    HAlign   = pTexInfo->Alignment.HAlign;
    MipWidth = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    __MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    for(i = 1; i <= __MipLevel; i++)
    {
        AlignedMipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

        if(Compressed)
        {
            AlignedMipWidth /= CompressWidth;
        }

        MipOffset += AlignedMipWidth;

        MipWidth = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, i));
    }

    MipOffset *= (pTexInfo->BitsPerPixel >> 3);

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       (MipLevel >= pTexInfo->Alignment.MipTailStartLod))
    {
        MipOffset += GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    GMM_DPF_EXIT;

    return (MipOffset);
}